

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

Object * executeIf(Object *__return_storage_ptr__,If ifs,Environment *env)

{
  Literal LVar1;
  LiteralType LStack_1c;
  Literal cond;
  Environment *env_local;
  
  LVar1 = resolveLiteral(ifs.condition,ifs.line,env);
  LStack_1c = LVar1.type;
  if (LStack_1c == LIT_LOGICAL) {
    cond.line = LVar1.field_2._0_4_;
    if (cond.line == 0) {
      executeBlock(__return_storage_ptr__,ifs.elseBranch,env);
    }
    else {
      executeBlock(__return_storage_ptr__,ifs.thenBranch,env);
    }
  }
  else {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Not a logical expression as condition!\x1b[0m",
           (ulong)(uint)ifs.line);
    stop();
    memcpy(__return_storage_ptr__,&nullObject,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

static Object executeIf(If ifs, Environment *env){
    //debug("Executing if statement");
    Literal cond = resolveLiteral(ifs.condition, ifs.line, env);
    if(cond.type != LIT_LOGICAL){
        printf(runtime_error("Not a logical expression as condition!"), ifs.line);
        stop();
        return nullObject;
    }
    if(cond.lVal){
        return executeBlock(ifs.thenBranch, env);
    }
    else{
        return executeBlock(ifs.elseBranch, env);
    }
}